

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.hpp
# Opt level: O3

var __thiscall cs::invoke<cs_impl::any>(cs *this,var *func,any *_args)

{
  char *pcVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined *puVar3;
  object_method *poVar4;
  callable *pcVar5;
  var extraout_RAX;
  runtime_error *this_00;
  long lVar6;
  initializer_list<cs_impl::any> __l;
  initializer_list<cs_impl::any> __l_00;
  vector args;
  allocator_type local_49;
  undefined1 local_48 [32];
  any local_28;
  proxy *local_20;
  
  if (func->mDat == (proxy *)0x0) {
    puVar3 = &void::typeinfo;
  }
  else {
    iVar2 = (*func->mDat->data->_vptr_baseHolder[2])();
    puVar3 = (undefined *)CONCAT44(extraout_var,iVar2);
  }
  pcVar1 = *(char **)(puVar3 + 8);
  if (pcVar1 == "N2cs8callableE") {
LAB_0016af4a:
    local_28 = (any)_args->mDat;
    _args->mDat = (proxy *)0x0;
    __l._M_len = 1;
    __l._M_array = &local_28;
    std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::vector
              ((vector<cs_impl::any,_std::allocator<cs_impl::any>_> *)local_48,__l,&local_49);
    cs_impl::any::recycle(&local_28);
    pcVar5 = cs_impl::any::const_val<cs::callable>(func);
    if ((pcVar5->mFunc).super__Function_base._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    (*(pcVar5->mFunc)._M_invoker)
              ((_Any_data *)this,(vector<cs_impl::any,_std::allocator<cs_impl::any>_> *)pcVar5);
  }
  else {
    if (*pcVar1 != '*') {
      iVar2 = strcmp(pcVar1,"N2cs8callableE");
      if (iVar2 == 0) goto LAB_0016af4a;
    }
    if (func->mDat == (proxy *)0x0) {
      puVar3 = &void::typeinfo;
    }
    else {
      iVar2 = (*func->mDat->data->_vptr_baseHolder[2])();
      puVar3 = (undefined *)CONCAT44(extraout_var_00,iVar2);
    }
    pcVar1 = *(char **)(puVar3 + 8);
    if (pcVar1 != "N2cs13object_methodE") {
      if (*pcVar1 == '*') {
LAB_0016b064:
        this_00 = (runtime_error *)__cxa_allocate_exception(0x28);
        local_48._0_8_ = local_48 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_48,"Invoke non-callable object.","");
        runtime_error::runtime_error(this_00,(string *)local_48);
        __cxa_throw(this_00,&runtime_error::typeinfo,runtime_error::~runtime_error);
      }
      iVar2 = strcmp(pcVar1,"N2cs13object_methodE");
      if (iVar2 != 0) goto LAB_0016b064;
    }
    poVar4 = cs_impl::any::const_val<cs::object_method>(func);
    local_28.mDat = (poVar4->object).mDat;
    if (local_28.mDat != (proxy *)0x0) {
      (local_28.mDat)->refcount = (local_28.mDat)->refcount + 1;
    }
    local_20 = _args->mDat;
    _args->mDat = (proxy *)0x0;
    __l_00._M_len = 2;
    __l_00._M_array = &local_28;
    std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::vector
              ((vector<cs_impl::any,_std::allocator<cs_impl::any>_> *)local_48,__l_00,&local_49);
    lVar6 = 8;
    do {
      cs_impl::any::recycle((any *)((long)&local_28.mDat + lVar6));
      lVar6 = lVar6 + -8;
    } while (lVar6 != -8);
    pcVar5 = cs_impl::any::const_val<cs::callable>(&poVar4->callable);
    if ((pcVar5->mFunc).super__Function_base._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    (*(pcVar5->mFunc)._M_invoker)
              ((_Any_data *)this,(vector<cs_impl::any,_std::allocator<cs_impl::any>_> *)pcVar5);
  }
  std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::~vector
            ((vector<cs_impl::any,_std::allocator<cs_impl::any>_> *)local_48);
  return (var)extraout_RAX.mDat;
}

Assistant:

static var invoke(const var &func, ArgsT &&... _args)
	{
		if (func.type() == typeid(callable)) {
			vector args{std::forward<ArgsT>(_args)...};
			return func.const_val<callable>().call(args);
		}
		else if (func.type() == typeid(object_method)) {
			const auto &om = func.const_val<object_method>();
			vector args{om.object, std::forward<ArgsT>(_args)...};
			return om.callable.const_val<callable>().call(args);
		}
		else
			throw runtime_error("Invoke non-callable object.");
	}